

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  Type TVar1;
  bool bVar2;
  Index IVar3;
  Type TVar4;
  const_reference pvVar5;
  size_type sVar6;
  string local_60;
  Type local_40;
  Type local_38;
  Type ty;
  size_t i;
  TypeVector *local_20;
  char *prefix_local;
  TypeVector *types_local;
  string *result;
  
  i._7_1_ = 0;
  local_20 = types;
  prefix_local = (char *)this;
  types_local = (TypeVector *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  if (local_20 != (TypeVector *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)local_20);
  }
  ty.enum_ = Any;
  ty.type_index_ = 0;
  for (; TVar1 = ty,
      TVar4 = (Type)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local),
      (ulong)TVar1 < (ulong)TVar4; ty = (Type)((long)ty + 1)) {
    pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local,
                        (size_type)ty);
    local_40.enum_ = pvVar5->enum_;
    local_40.type_index_ = pvVar5->type_index_;
    local_38 = local_40;
    bVar2 = wabt::operator==(local_40,Reference);
    if ((bVar2) && (IVar3 = Type::GetReferenceIndex(&local_38), IVar3 == 0xffffffff)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"reference");
    }
    else {
      pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local,
                          (size_type)ty);
      Type::GetName_abi_cxx11_(&local_60,pvVar5);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    TVar1 = ty;
    sVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local);
    if ((ulong)TVar1 < sVar6 - 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    Type ty = types[i];
    // NOTE: Reference (and GetName) is also used by (e.g.) objdump, which does
    // not apply validation. do this here so as to not break that.
    if (ty == Type::Reference && ty.GetReferenceIndex() == kInvalidIndex) {
      result += "reference";
    } else {
      result += types[i].GetName();
    }
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}